

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRItemFactory.h
# Opt level: O2

void __thiscall
MinVR::VRConcreteItemFactory<MinVR::VRInputDevice,_MinVR::VRFakeHandTrackerDevice>::
~VRConcreteItemFactory
          (VRConcreteItemFactory<MinVR::VRInputDevice,_MinVR::VRFakeHandTrackerDevice> *this)

{
  VRSpecificItemFactory<MinVR::VRInputDevice>::~VRSpecificItemFactory
            (&this->super_VRSpecificItemFactory<MinVR::VRInputDevice>);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~VRConcreteItemFactory() {}